

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftoutln.c
# Opt level: O1

FT_Error FT_Outline_Decompose(FT_Outline *outline,FT_Outline_Funcs *func_interface,void *user)

{
  int iVar1;
  long lVar2;
  FT_Vector *pFVar3;
  FT_Pos *pFVar4;
  FT_Error FVar5;
  int iVar6;
  byte bVar7;
  char cVar8;
  FT_Vector *pFVar9;
  FT_Vector *pFVar10;
  long lVar11;
  ulong uVar12;
  char *pcVar13;
  char *pcVar14;
  FT_Pos *pFVar15;
  FT_Vector vec;
  FT_Vector v_control;
  FT_Vector v_middle;
  FT_Vector vec_2;
  FT_Vector local_a8;
  uint local_8c;
  FT_Vector local_88;
  FT_Vector local_78;
  uint local_5c;
  FT_Vector local_58;
  FT_Vector *local_48;
  FT_Vector local_40;
  
  iVar6 = 0x14;
  FVar5 = 0x14;
  if (outline != (FT_Outline *)0x0) {
    if (func_interface == (FT_Outline_Funcs *)0x0) {
      FVar5 = 6;
    }
    else {
      if (0 < outline->n_contours) {
        lVar2 = func_interface->delta;
        iVar1 = func_interface->shift;
        lVar11 = 0;
        local_8c = 0;
        do {
          local_5c = (uint)outline->contours[lVar11];
          cVar8 = '\a';
          if (-1 < outline->contours[lVar11]) {
            pFVar3 = outline->points;
            uVar12 = (ulong)local_8c;
            bVar7 = (byte)iVar1;
            local_78.x = (pFVar3[uVar12].x << (bVar7 & 0x3f)) - lVar2;
            local_78.y = (pFVar3[uVar12].y << (bVar7 & 0x3f)) - lVar2;
            pcVar14 = outline->tags;
            if ((pcVar14[uVar12] & 3U) == 2) {
              cVar8 = '\a';
            }
            else {
              pFVar10 = pFVar3 + local_5c;
              pFVar9 = pFVar3 + uVar12;
              pcVar13 = pcVar14 + uVar12;
              local_a8.x = local_78.x;
              local_a8.y = local_78.y;
              if ((pcVar14[uVar12] & 3U) == 0) {
                local_a8.x = (pFVar3[local_5c].x << (bVar7 & 0x3f)) - lVar2;
                local_a8.y = (pFVar3[local_5c].y << (bVar7 & 0x3f)) - lVar2;
                if ((pcVar14[local_5c] & 3U) == 1) {
                  pFVar10 = pFVar10 + -1;
                }
                else {
                  local_a8.x = (local_a8.x + local_78.x) / 2;
                  local_a8.y = (local_a8.y + local_78.y) / 2;
                }
                pFVar9 = pFVar9 + -1;
                pcVar13 = pcVar13 + -1;
              }
              iVar6 = (*func_interface->move_to)(&local_a8,user);
              if (iVar6 == 0) {
                if (pFVar9 < pFVar10) {
                  iVar6 = 0;
                  do {
                    pcVar14 = pcVar13 + 1;
                    if ((pcVar13[1] & 3U) == 0) {
                      local_78.x = (pFVar9[1].x << (bVar7 & 0x3f)) - lVar2;
                      local_78.y = (pFVar9[1].y << (bVar7 & 0x3f)) - lVar2;
                      pFVar4 = &pFVar9[2].y;
                      do {
                        pFVar15 = pFVar4;
                        if (pFVar10 <= (FT_Vector *)(pFVar15 + -3)) {
                          iVar6 = (*func_interface->conic_to)(&local_78,&local_a8,user);
                          goto LAB_0013695b;
                        }
                        local_88.x = (((FT_Vector *)(pFVar15 + -1))->x << (bVar7 & 0x3f)) - lVar2;
                        local_88.y = (*pFVar15 << (bVar7 & 0x3f)) - lVar2;
                        if ((pcVar14[1] & 3U) == 0) {
                          local_58.x = (local_88.x + local_78.x) / 2;
                          local_58.y = (local_88.y + local_78.y) / 2;
                          iVar6 = (*func_interface->conic_to)(&local_78,&local_58,user);
                          if (iVar6 == 0) {
                            local_78.x = local_88.x;
                            local_78.y = local_88.y;
                            cVar8 = '\x10';
                            iVar6 = 0;
                          }
                          else {
                            cVar8 = '\n';
                          }
                        }
                        else {
                          cVar8 = '\a';
                          if ((pcVar14[1] & 3U) == 1) {
                            iVar6 = (*func_interface->conic_to)(&local_78,&local_88,user);
                            cVar8 = (iVar6 == 0) + '\n';
                          }
                        }
                        pcVar14 = pcVar14 + 1;
                        pFVar4 = pFVar15 + 2;
                      } while (cVar8 == '\x10');
                      if (cVar8 != '\v') goto LAB_0013697a;
                      pFVar9 = (FT_Vector *)(pFVar15 + -1);
                      pcVar13 = pcVar14;
                    }
                    else {
                      pFVar3 = pFVar9 + 1;
                      if ((pcVar13[1] & 3U) == 1) {
                        local_88.x = (pFVar9[1].x << (bVar7 & 0x3f)) - lVar2;
                        local_88.y = (pFVar9[1].y << (bVar7 & 0x3f)) - lVar2;
                        iVar6 = (*func_interface->line_to)(&local_88,user);
                        pFVar9 = pFVar3;
                        pcVar13 = pcVar14;
                        if (iVar6 != 0) goto LAB_0013665f;
                      }
                      else {
                        cVar8 = '\a';
                        local_48 = pFVar3;
                        if ((pFVar9 + 2 <= pFVar10) && ((pcVar13[2] & 3U) == 2)) {
                          local_88.x = (pFVar9[1].x << (bVar7 & 0x3f)) - lVar2;
                          local_88.y = (pFVar9[1].y << (bVar7 & 0x3f)) - lVar2;
                          local_48 = pFVar9 + 3;
                          local_58.x = (pFVar9[2].x << (bVar7 & 0x3f)) - lVar2;
                          pcVar14 = pcVar13 + 3;
                          local_58.y = (pFVar9[2].y << (bVar7 & 0x3f)) - lVar2;
                          if (pFVar10 < local_48) {
                            iVar6 = (*func_interface->cubic_to)(&local_88,&local_58,&local_a8,user);
                            cVar8 = '\x17';
                          }
                          else {
                            local_40.x = (pFVar9[3].x << (bVar7 & 0x3f)) - lVar2;
                            local_40.y = (pFVar9[3].y << (bVar7 & 0x3f)) - lVar2;
                            iVar6 = (*func_interface->cubic_to)(&local_88,&local_58,&local_40,user);
                            cVar8 = (iVar6 == 0) + '\n';
                          }
                        }
                        pFVar9 = local_48;
                        pcVar13 = pcVar14;
                        if (cVar8 != '\v') {
                          if (cVar8 == '\x17') goto LAB_0013695b;
                          goto LAB_0013697a;
                        }
                      }
                    }
                  } while (pFVar9 < pFVar10);
                }
                iVar6 = (*func_interface->line_to)(&local_a8,user);
LAB_0013695b:
                cVar8 = '\n';
                if (iVar6 == 0) {
                  local_8c = local_5c + 1;
                  iVar6 = 0;
                  cVar8 = '\0';
                }
              }
              else {
LAB_0013665f:
                cVar8 = '\n';
              }
            }
          }
LAB_0013697a:
          if (cVar8 != '\0') {
            if (cVar8 != '\a') {
              return iVar6;
            }
            return 0x14;
          }
          lVar11 = lVar11 + 1;
        } while (lVar11 < outline->n_contours);
      }
      FVar5 = 0;
    }
  }
  return FVar5;
}

Assistant:

FT_EXPORT_DEF( FT_Error )
  FT_Outline_Decompose( FT_Outline*              outline,
                        const FT_Outline_Funcs*  func_interface,
                        void*                    user )
  {
#undef  SCALED
#define SCALED( x )  ( ( (x) < 0 ? -( -(x) << shift )             \
                                 :  (  (x) << shift ) ) - delta )

    FT_Vector   v_last;
    FT_Vector   v_control;
    FT_Vector   v_start;

    FT_Vector*  point;
    FT_Vector*  limit;
    char*       tags;

    FT_Error    error;

    FT_Int   n;         /* index of contour in outline     */
    FT_UInt  first;     /* index of first point in contour */
    FT_Int   tag;       /* current point's state           */

    FT_Int   shift;
    FT_Pos   delta;


    if ( !outline )
      return FT_THROW( Invalid_Outline );

    if ( !func_interface )
      return FT_THROW( Invalid_Argument );

    shift = func_interface->shift;
    delta = func_interface->delta;
    first = 0;

    for ( n = 0; n < outline->n_contours; n++ )
    {
      FT_Int  last;  /* index of last point in contour */


      FT_TRACE5(( "FT_Outline_Decompose: Outline %d\n", n ));

      last = outline->contours[n];
      if ( last < 0 )
        goto Invalid_Outline;
      limit = outline->points + last;

      v_start   = outline->points[first];
      v_start.x = SCALED( v_start.x );
      v_start.y = SCALED( v_start.y );

      v_last   = outline->points[last];
      v_last.x = SCALED( v_last.x );
      v_last.y = SCALED( v_last.y );

      v_control = v_start;

      point = outline->points + first;
      tags  = outline->tags   + first;
      tag   = FT_CURVE_TAG( tags[0] );

      /* A contour cannot start with a cubic control point! */
      if ( tag == FT_CURVE_TAG_CUBIC )
        goto Invalid_Outline;

      /* check first point to determine origin */
      if ( tag == FT_CURVE_TAG_CONIC )
      {
        /* first point is conic control.  Yes, this happens. */
        if ( FT_CURVE_TAG( outline->tags[last] ) == FT_CURVE_TAG_ON )
        {
          /* start at last point if it is on the curve */
          v_start = v_last;
          limit--;
        }
        else
        {
          /* if both first and last points are conic,         */
          /* start at their middle and record its position    */
          /* for closure                                      */
          v_start.x = ( v_start.x + v_last.x ) / 2;
          v_start.y = ( v_start.y + v_last.y ) / 2;

       /* v_last = v_start; */
        }
        point--;
        tags--;
      }

      FT_TRACE5(( "  move to (%.2f, %.2f)\n",
                  v_start.x / 64.0, v_start.y / 64.0 ));
      error = func_interface->move_to( &v_start, user );
      if ( error )
        goto Exit;

      while ( point < limit )
      {
        point++;
        tags++;

        tag = FT_CURVE_TAG( tags[0] );
        switch ( tag )
        {
        case FT_CURVE_TAG_ON:  /* emit a single line_to */
          {
            FT_Vector  vec;


            vec.x = SCALED( point->x );
            vec.y = SCALED( point->y );

            FT_TRACE5(( "  line to (%.2f, %.2f)\n",
                        vec.x / 64.0, vec.y / 64.0 ));
            error = func_interface->line_to( &vec, user );
            if ( error )
              goto Exit;
            continue;
          }

        case FT_CURVE_TAG_CONIC:  /* consume conic arcs */
          v_control.x = SCALED( point->x );
          v_control.y = SCALED( point->y );

        Do_Conic:
          if ( point < limit )
          {
            FT_Vector  vec;
            FT_Vector  v_middle;


            point++;
            tags++;
            tag = FT_CURVE_TAG( tags[0] );

            vec.x = SCALED( point->x );
            vec.y = SCALED( point->y );

            if ( tag == FT_CURVE_TAG_ON )
            {
              FT_TRACE5(( "  conic to (%.2f, %.2f)"
                          " with control (%.2f, %.2f)\n",
                          vec.x / 64.0, vec.y / 64.0,
                          v_control.x / 64.0, v_control.y / 64.0 ));
              error = func_interface->conic_to( &v_control, &vec, user );
              if ( error )
                goto Exit;
              continue;
            }

            if ( tag != FT_CURVE_TAG_CONIC )
              goto Invalid_Outline;

            v_middle.x = ( v_control.x + vec.x ) / 2;
            v_middle.y = ( v_control.y + vec.y ) / 2;

            FT_TRACE5(( "  conic to (%.2f, %.2f)"
                        " with control (%.2f, %.2f)\n",
                        v_middle.x / 64.0, v_middle.y / 64.0,
                        v_control.x / 64.0, v_control.y / 64.0 ));
            error = func_interface->conic_to( &v_control, &v_middle, user );
            if ( error )
              goto Exit;

            v_control = vec;
            goto Do_Conic;
          }

          FT_TRACE5(( "  conic to (%.2f, %.2f)"
                      " with control (%.2f, %.2f)\n",
                      v_start.x / 64.0, v_start.y / 64.0,
                      v_control.x / 64.0, v_control.y / 64.0 ));
          error = func_interface->conic_to( &v_control, &v_start, user );
          goto Close;

        default:  /* FT_CURVE_TAG_CUBIC */
          {
            FT_Vector  vec1, vec2;


            if ( point + 1 > limit                             ||
                 FT_CURVE_TAG( tags[1] ) != FT_CURVE_TAG_CUBIC )
              goto Invalid_Outline;

            point += 2;
            tags  += 2;

            vec1.x = SCALED( point[-2].x );
            vec1.y = SCALED( point[-2].y );

            vec2.x = SCALED( point[-1].x );
            vec2.y = SCALED( point[-1].y );

            if ( point <= limit )
            {
              FT_Vector  vec;


              vec.x = SCALED( point->x );
              vec.y = SCALED( point->y );

              FT_TRACE5(( "  cubic to (%.2f, %.2f)"
                          " with controls (%.2f, %.2f) and (%.2f, %.2f)\n",
                          vec.x / 64.0, vec.y / 64.0,
                          vec1.x / 64.0, vec1.y / 64.0,
                          vec2.x / 64.0, vec2.y / 64.0 ));
              error = func_interface->cubic_to( &vec1, &vec2, &vec, user );
              if ( error )
                goto Exit;
              continue;
            }

            FT_TRACE5(( "  cubic to (%.2f, %.2f)"
                        " with controls (%.2f, %.2f) and (%.2f, %.2f)\n",
                        v_start.x / 64.0, v_start.y / 64.0,
                        vec1.x / 64.0, vec1.y / 64.0,
                        vec2.x / 64.0, vec2.y / 64.0 ));
            error = func_interface->cubic_to( &vec1, &vec2, &v_start, user );
            goto Close;
          }
        }
      }

      /* close the contour with a line segment */
      FT_TRACE5(( "  line to (%.2f, %.2f)\n",
                  v_start.x / 64.0, v_start.y / 64.0 ));
      error = func_interface->line_to( &v_start, user );

    Close:
      if ( error )
        goto Exit;

      first = (FT_UInt)last + 1;
    }

    FT_TRACE5(( "FT_Outline_Decompose: Done\n", n ));
    return FT_Err_Ok;

  Exit:
    FT_TRACE5(( "FT_Outline_Decompose: Error 0x%x\n", error ));
    return error;

  Invalid_Outline:
    return FT_THROW( Invalid_Outline );
  }